

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlNsPtr * xmlGetNsList(xmlDoc *doc,xmlNode *node)

{
  int iVar1;
  xmlNsPtr *ppxVar2;
  ulong uVar3;
  xmlNsPtr pxVar4;
  int iVar5;
  uint uVar6;
  
  if ((node == (xmlNode *)0x0) || (uVar6 = 0, node->type == XML_NAMESPACE_DECL)) {
    ppxVar2 = (xmlNsPtr *)0x0;
  }
  else {
    iVar5 = 10;
    ppxVar2 = (xmlNsPtr *)0x0;
    do {
      if (node->type == XML_ELEMENT_NODE) {
        for (pxVar4 = node->nsDef; pxVar4 != (xmlNsPtr)0x0; pxVar4 = pxVar4->next) {
          if (ppxVar2 == (xmlNsPtr *)0x0) {
            ppxVar2 = (xmlNsPtr *)(*xmlMalloc)((long)iVar5 * 8 + 8);
            if (ppxVar2 == (xmlNsPtr *)0x0) goto LAB_00186382;
            ppxVar2[(int)uVar6] = (xmlNsPtr)0x0;
          }
          if (0 < (int)uVar6) {
            uVar3 = 0;
            do {
              if ((pxVar4->prefix == ppxVar2[uVar3]->prefix) ||
                 (iVar1 = xmlStrEqual(pxVar4->prefix,ppxVar2[uVar3]->prefix), iVar1 != 0))
              goto LAB_00186366;
              uVar3 = uVar3 + 1;
            } while (uVar6 != uVar3);
          }
          if (iVar5 <= (int)uVar6) {
            ppxVar2 = (xmlNsPtr *)(*xmlRealloc)(ppxVar2,(long)(iVar5 * 2 + 1) << 3);
            if (ppxVar2 == (xmlNsPtr *)0x0) {
LAB_00186382:
              __xmlSimpleError(2,2,(xmlNodePtr)0x0,(char *)0x0,"getting namespace list");
              return (xmlNsPtr *)0x0;
            }
            iVar5 = iVar5 * 2;
          }
          ppxVar2[(int)uVar6] = pxVar4;
          ppxVar2[(long)(int)uVar6 + 1] = (xmlNsPtr)0x0;
          uVar6 = uVar6 + 1;
LAB_00186366:
        }
      }
      node = node->parent;
    } while (node != (_xmlNode *)0x0);
  }
  return ppxVar2;
}

Assistant:

xmlNsPtr *
xmlGetNsList(const xmlDoc *doc ATTRIBUTE_UNUSED, const xmlNode *node)
{
    xmlNsPtr cur;
    xmlNsPtr *ret = NULL;
    int nbns = 0;
    int maxns = 10;
    int i;

    if ((node == NULL) || (node->type == XML_NAMESPACE_DECL))
        return(NULL);

    while (node != NULL) {
        if (node->type == XML_ELEMENT_NODE) {
            cur = node->nsDef;
            while (cur != NULL) {
                if (ret == NULL) {
                    ret =
                        (xmlNsPtr *) xmlMalloc((maxns + 1) *
                                               sizeof(xmlNsPtr));
                    if (ret == NULL) {
			xmlTreeErrMemory("getting namespace list");
                        return (NULL);
                    }
                    ret[nbns] = NULL;
                }
                for (i = 0; i < nbns; i++) {
                    if ((cur->prefix == ret[i]->prefix) ||
                        (xmlStrEqual(cur->prefix, ret[i]->prefix)))
                        break;
                }
                if (i >= nbns) {
                    if (nbns >= maxns) {
                        maxns *= 2;
                        ret = (xmlNsPtr *) xmlRealloc(ret,
                                                      (maxns +
                                                       1) *
                                                      sizeof(xmlNsPtr));
                        if (ret == NULL) {
			    xmlTreeErrMemory("getting namespace list");
                            return (NULL);
                        }
                    }
                    ret[nbns++] = cur;
                    ret[nbns] = NULL;
                }

                cur = cur->next;
            }
        }
        node = node->parent;
    }
    return (ret);
}